

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_hmac_reset(mbedtls_md_context_t *ctx)

{
  uchar *input;
  uchar *ipad;
  int ret;
  mbedtls_md_context_t *ctx_local;
  
  if (((ctx == (mbedtls_md_context_t *)0x0) || (ctx->md_info == (mbedtls_md_info_t *)0x0)) ||
     (ctx->hmac_ctx == (void *)0x0)) {
    ctx_local._4_4_ = -0x5100;
  }
  else {
    input = (uchar *)ctx->hmac_ctx;
    ctx_local._4_4_ = mbedtls_md_starts(ctx);
    if (ctx_local._4_4_ == 0) {
      ctx_local._4_4_ = mbedtls_md_update(ctx,input,(ulong)ctx->md_info->block_size);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_md_hmac_reset( mbedtls_md_context_t *ctx )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *ipad;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    ipad = (unsigned char *) ctx->hmac_ctx;

    if( ( ret = mbedtls_md_starts( ctx ) ) != 0 )
        return( ret );
    return( mbedtls_md_update( ctx, ipad, ctx->md_info->block_size ) );
}